

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O1

void __thiscall Grid::setslime(Grid *this,point p,bool slime)

{
  refc<cg_other> *this_00;
  pointer *ppcVar1;
  size_t __n;
  int iVar2;
  uint uVar3;
  uint uVar4;
  cg_box *pcVar5;
  pointer pcVar6;
  point pVar7;
  iterator __position;
  cg_box *pcVar8;
  int *piVar9;
  uint *puVar10;
  cg_other *pcVar11;
  pointer pcVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  cgo_char local_48;
  refc<cg_box> *local_38;
  
  if ((((p.x < 0) || ((long)p < 0)) || (pcVar5 = (this->box).ptr, pcVar5->w <= p.x)) ||
     (pcVar5->h <= p.y)) {
    this_00 = &this->other;
    if (1 < *(this->other).count) {
      pcVar11 = (cg_other *)operator_new(0x18);
      std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::vector
                ((vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_> *)pcVar11,
                 &this_00->ptr->data);
      refc<cg_other>::decrement(this_00);
      (this->other).ptr = pcVar11;
      piVar9 = (int *)operator_new(4);
      *piVar9 = 1;
      (this->other).count = piVar9;
    }
    pcVar11 = this_00->ptr;
    pcVar12 = (pcVar11->data).
              super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar6 = (pcVar11->data).
             super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar15 = pcVar12 == pcVar6;
    if (!bVar15) {
      pVar7 = pcVar12->p;
      while (pVar7 != p) {
        pcVar12 = pcVar12 + 1;
        bVar15 = pcVar12 == pcVar6;
        if (bVar15) goto LAB_0010dc76;
        pVar7 = pcVar12->p;
      }
      pcVar12->ch = (uint)slime << ((byte)this->SLIMEBIT_SHIFT & 0x1f) |
                    ~this->SLIMEBIT & pcVar12->ch;
      if (!bVar15) {
        return;
      }
    }
LAB_0010dc76:
    local_48.ch = this->SLIMEBIT | 0x80000000;
    __position._M_current =
         (pcVar11->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pcVar11->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_48.p = p;
      std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::
      _M_realloc_insert<cg_other::cgo_char>(&pcVar11->data,__position,&local_48);
    }
    else {
      (__position._M_current)->ch = local_48.ch;
      (__position._M_current)->p = p;
      ppcVar1 = &(pcVar11->data).
                 super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  else {
    if (1 < *(this->box).count) {
      pcVar8 = (cg_box *)operator_new(0x10);
      iVar2 = pcVar5->w;
      pcVar8->w = iVar2;
      iVar13 = pcVar5->h;
      pcVar8->h = iVar13;
      iVar13 = iVar13 * iVar2;
      __n = (long)iVar13 * 4;
      uVar14 = 0xffffffffffffffff;
      if (-1 < iVar13) {
        uVar14 = __n;
      }
      piVar9 = (int *)operator_new__(uVar14);
      local_38 = &this->box;
      pcVar8->data = piVar9;
      memcpy(piVar9,pcVar5->data,__n);
      refc<cg_box>::decrement(local_38);
      (this->box).ptr = pcVar8;
      piVar9 = (int *)operator_new(4);
      *piVar9 = 1;
      (this->box).count = piVar9;
    }
    puVar10 = (uint *)cg_box::at((this->box).ptr,p);
    uVar3 = this->SLIMEBIT;
    iVar2 = this->SLIMEBIT_SHIFT;
    uVar4 = *puVar10;
    puVar10 = (uint *)cg_box::at((this->box).ptr,p);
    *puVar10 = (uint)slime << ((byte)iVar2 & 0x1f) | ~uVar3 & uVar4;
  }
  return;
}

Assistant:

void Grid::setslime(point p, bool slime) {
    if (box->contains(p)) {
        uniquify(box);
        box->at(p) = (box->at(p) & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
        return;
    }
    uniquify(other);
    for (auto &d: other->data) {
        if (d.p == p) {
            d.ch = (d.ch & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
            return;
        }
    }
    other->data.push_back({ p, OUT_CHAR | SLIMEBIT });
}